

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

Cnf_Dat_t * Cnf_ManWriteCnf(Cnf_Man_t *p,Vec_Ptr_t *vMapped,int nOutputs)

{
  void **ppvVar1;
  char cVar2;
  void **ppvVar3;
  char *pcVar4;
  int *piVar5;
  void *pvVar6;
  int iVar7;
  Cnf_Dat_t *pCVar8;
  int **ppiVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  Vec_Ptr_t *pVVar16;
  int iVar17;
  Vec_Int_t *pVVar18;
  int nVars;
  int iVar19;
  ulong uVar20;
  long lVar21;
  Aig_Man_t *pAVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int pVars [32];
  int local_b8 [34];
  
  pAVar22 = p->pManAig;
  iVar29 = pAVar22->nObjs[3] + 1 + nOutputs * 3;
  iVar25 = pAVar22->nObjs[3] + nOutputs + 1;
  iVar13 = vMapped->nSize;
  if (0 < (long)iVar13) {
    ppvVar3 = vMapped->pArray;
    lVar24 = 0;
    do {
      if ((*(uint *)((long)ppvVar3[lVar24] + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0xd7,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      pcVar4 = *(char **)((long)ppvVar3[lVar24] + 0x28);
      cVar2 = *pcVar4;
      nVars = (int)cVar2;
      if (nVars < 5) {
        uVar26 = (ulong)p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18)];
        if ((long)uVar26 < 1) {
          iVar17 = 0;
        }
        else {
          uVar14 = 0;
          iVar17 = 0;
          do {
            iVar19 = 4;
            iVar7 = (int)p->pSops[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18)][uVar14];
            do {
              iVar17 = iVar17 + (uint)(iVar7 % 3 != 2);
              iVar19 = iVar19 + -1;
              iVar7 = iVar7 / 3;
            } while (iVar19 != 0);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar26);
        }
        if (p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18)] < '\0') {
          __assert_fail("p->pSopSizes[uTruth] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                        ,0xdf,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
        }
      }
      else {
        pVVar11 = *(Vec_Int_t **)(pcVar4 + 0x10);
        iVar17 = Cnf_IsopCountLiterals(pVVar11,nVars);
        uVar26 = (ulong)(uint)pVVar11->nSize;
      }
      if (cVar2 < '\x05') {
        uVar14 = (ulong)p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18) ^ 0xffff];
        if ((long)uVar14 < 1) {
          iVar7 = 0;
        }
        else {
          uVar20 = 0;
          iVar7 = 0;
          do {
            iVar23 = 4;
            iVar19 = (int)p->pSops[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18) ^ 0xffff][uVar20];
            do {
              iVar7 = iVar7 + (uint)(iVar19 % 3 != 2);
              iVar23 = iVar23 + -1;
              iVar19 = iVar19 / 3;
            } while (iVar23 != 0);
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar14);
        }
        if (p->pSopSizes[*(ushort *)(pcVar4 + (long)nVars * 4 + 0x18) ^ 0xffff] < '\0') {
          __assert_fail("p->pSopSizes[uTruth] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                        ,0xec,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
        }
      }
      else {
        pVVar11 = *(Vec_Int_t **)(pcVar4 + 8);
        iVar7 = Cnf_IsopCountLiterals(pVVar11,nVars);
        uVar14 = (ulong)(uint)pVVar11->nSize;
      }
      iVar25 = iVar25 + (int)uVar26 + (int)uVar14;
      iVar29 = iVar29 + iVar17 + (int)uVar26 + iVar7 + (int)uVar14;
      lVar24 = lVar24 + 1;
    } while (lVar24 != iVar13);
  }
  pCVar8 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar8->pMan = pAVar22;
  pCVar8->nLiterals = iVar29;
  pCVar8->nClauses = iVar25;
  lVar24 = (long)iVar25;
  ppiVar9 = (int **)malloc(lVar24 * 8 + 8);
  pCVar8->pClauses = ppiVar9;
  lVar27 = (long)iVar29;
  piVar10 = (int *)malloc(lVar27 * 4);
  *ppiVar9 = piVar10;
  ppiVar9[lVar24] = piVar10 + lVar27;
  pVVar16 = pAVar22->vObjs;
  lVar28 = (long)pVVar16->nSize;
  piVar10 = (int *)malloc(lVar28 * 4);
  pCVar8->pVarNums = piVar10;
  if (0 < lVar28) {
    lVar28 = 0;
    do {
      piVar10[lVar28] = -1;
      lVar28 = lVar28 + 1;
    } while (lVar28 < pVVar16->nSize);
  }
  iVar13 = 1;
  if (nOutputs != 0) {
    iVar25 = pAVar22->nRegs;
    if (iVar25 == 0) {
      if (pAVar22->nObjs[3] != nOutputs) {
        __assert_fail("nOutputs == Aig_ManCoNum(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x10e,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      pVVar16 = pAVar22->vCos;
      if (0 < pVVar16->nSize) {
        ppvVar3 = pVVar16->pArray;
        lVar28 = 0;
        do {
          ppvVar1 = ppvVar3 + lVar28;
          lVar28 = lVar28 + 1;
          piVar10[*(int *)((long)*ppvVar1 + 0x24)] = (int)lVar28;
        } while (lVar28 < pVVar16->nSize);
        iVar13 = (int)lVar28 + 1;
      }
    }
    else {
      if (iVar25 != nOutputs) {
        __assert_fail("nOutputs == Aig_ManRegNum(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x114,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
      }
      uVar15 = pAVar22->nObjs[3] - iVar25;
      pVVar16 = pAVar22->vCos;
      if ((int)uVar15 < pVVar16->nSize) {
        uVar26 = (ulong)uVar15;
        iVar13 = 1;
        do {
          if ((int)uVar15 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          piVar10[*(int *)((long)pVVar16->pArray[uVar26] + 0x24)] = iVar13;
          iVar13 = iVar13 + 1;
          uVar26 = uVar26 + 1;
        } while ((int)uVar26 < pVVar16->nSize);
      }
    }
  }
  iVar25 = vMapped->nSize;
  if (0 < (long)iVar25) {
    ppvVar3 = vMapped->pArray;
    lVar28 = 0;
    do {
      piVar10[*(int *)((long)ppvVar3[lVar28] + 0x24)] = iVar13 + (int)lVar28;
      lVar28 = lVar28 + 1;
    } while (iVar25 != lVar28);
    iVar13 = iVar13 + (int)lVar28;
  }
  pVVar16 = pAVar22->vCis;
  if (0 < pVVar16->nSize) {
    ppvVar3 = pVVar16->pArray;
    lVar28 = 0;
    do {
      piVar10[*(int *)((long)ppvVar3[lVar28] + 0x24)] = iVar13 + (int)lVar28;
      lVar28 = lVar28 + 1;
    } while (lVar28 < pVVar16->nSize);
    iVar13 = iVar13 + (int)lVar28;
  }
  piVar10[pAVar22->pConst1->Id] = iVar13;
  pCVar8->nVars = iVar13 + 1;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 0x10000;
  pVVar11->nSize = 0;
  piVar10 = (int *)malloc(0x40000);
  pVVar11->pArray = piVar10;
  piVar10 = *ppiVar9;
  if (0 < vMapped->nSize) {
    lVar28 = 0;
    do {
      pcVar4 = *(char **)((long)vMapped->pArray[lVar28] + 0x28);
      piVar5 = pCVar8->pVarNums;
      iVar13 = piVar5[*(int *)((long)vMapped->pArray[lVar28] + 0x24)];
      cVar2 = *pcVar4;
      lVar12 = (long)cVar2;
      if (0 < lVar12) {
        iVar25 = p->pManAig->vObjs->nSize;
        lVar21 = 0;
        do {
          iVar29 = piVar5[*(int *)(pcVar4 + lVar21 * 4 + 0x18)];
          local_b8[lVar21] = iVar29;
          if (iVar25 < iVar29) {
            __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                          ,0x14d,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
          }
          lVar21 = lVar21 + 1;
        } while (lVar12 != lVar21);
      }
      if (cVar2 < '\x05') {
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar4 + lVar12 * 4 + 0x18)],
                   (int)p->pSopSizes[*(ushort *)(pcVar4 + lVar12 * 4 + 0x18)],pVVar11);
        pVVar18 = pVVar11;
      }
      else {
        pVVar18 = *(Vec_Int_t **)(pcVar4 + 0x10);
      }
      if (0 < pVVar18->nSize) {
        lVar12 = 0;
        lVar21 = 0;
        do {
          iVar25 = pVVar18->pArray[lVar21];
          ppiVar9[lVar21] = piVar10;
          *piVar10 = iVar13 * 2;
          iVar25 = Cnf_IsopWriteCube(iVar25,(int)*pcVar4,local_b8,piVar10 + 1);
          piVar10 = piVar10 + (long)iVar25 + 1;
          lVar21 = lVar21 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar21 < pVVar18->nSize);
        ppiVar9 = (int **)((long)ppiVar9 + lVar12);
      }
      if ((long)*pcVar4 < 5) {
        Cnf_SopConvertToVector
                  (p->pSops[*(ushort *)(pcVar4 + (long)*pcVar4 * 4 + 0x18) ^ 0xffff],
                   (int)p->pSopSizes[*(ushort *)(pcVar4 + (long)*pcVar4 * 4 + 0x18) ^ 0xffff],
                   pVVar11);
        pVVar18 = pVVar11;
      }
      else {
        pVVar18 = *(Vec_Int_t **)(pcVar4 + 8);
      }
      if (0 < pVVar18->nSize) {
        lVar12 = 0;
        lVar21 = 0;
        do {
          iVar25 = pVVar18->pArray[lVar21];
          ppiVar9[lVar21] = piVar10;
          *piVar10 = iVar13 * 2 + 1;
          iVar25 = Cnf_IsopWriteCube(iVar25,(int)*pcVar4,local_b8,piVar10 + 1);
          piVar10 = piVar10 + (long)iVar25 + 1;
          lVar21 = lVar21 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar21 < pVVar18->nSize);
        ppiVar9 = (int **)((long)ppiVar9 + lVar12);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 < vMapped->nSize);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  iVar13 = pCVar8->pVarNums[p->pManAig->pConst1->Id];
  if (p->pManAig->vObjs->nSize < iVar13) {
    __assert_fail("OutVar <= Aig_ManObjNumMax(p->pManAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x174,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
  }
  *ppiVar9 = piVar10;
  ppiVar9 = ppiVar9 + 1;
  *piVar10 = iVar13 * 2;
  piVar10 = piVar10 + 1;
  pAVar22 = p->pManAig;
  pVVar16 = pAVar22->vCos;
  if (0 < pVVar16->nSize) {
    lVar28 = 0;
    do {
      pvVar6 = pVVar16->pArray[lVar28];
      iVar13 = pCVar8->pVarNums
               [*(int *)((*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe) + 0x24)];
      if (lVar28 < (long)pAVar22->nObjs[3] - (long)nOutputs) {
        *ppiVar9 = piVar10;
        *piVar10 = (*(uint *)((long)pvVar6 + 8) & 1) + iVar13 * 2;
        piVar10 = piVar10 + 1;
        ppiVar9 = ppiVar9 + 1;
      }
      else {
        iVar25 = pCVar8->pVarNums[*(int *)((long)pvVar6 + 0x24)];
        *ppiVar9 = piVar10;
        *piVar10 = iVar25 * 2;
        piVar10[1] = (*(uint *)((long)pvVar6 + 8) & 1) + iVar13 * 2 ^ 1;
        ppiVar9[1] = piVar10 + 2;
        ppiVar9 = ppiVar9 + 2;
        piVar10[2] = iVar25 * 2 + 1;
        piVar10[3] = (*(uint *)((long)pvVar6 + 8) & 1) + iVar13 * 2;
        piVar10 = piVar10 + 4;
      }
      lVar28 = lVar28 + 1;
      pAVar22 = p->pManAig;
      pVVar16 = pAVar22->vCos;
    } while (lVar28 < pVVar16->nSize);
  }
  if ((long)piVar10 - (long)*pCVar8->pClauses >> 2 != lVar27) {
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,400,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
  }
  if ((long)ppiVar9 - (long)pCVar8->pClauses >> 3 != lVar24) {
    __assert_fail("pClas - pCnf->pClauses == nClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x191,"Cnf_Dat_t *Cnf_ManWriteCnf(Cnf_Man_t *, Vec_Ptr_t *, int)");
  }
  return pCVar8;
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnf( Cnf_Man_t * p, Vec_Ptr_t * vMapped, int nOutputs )
{
    int fChangeVariableOrder = 0; // should be set to 0 to improve performance
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube, Number;

    // count the number of literals and clauses
    nLiterals = 1 + Aig_ManCoNum( p->pManAig ) + 3 * nOutputs;
    nClauses = 1 + Aig_ManCoNum( p->pManAig ) + nOutputs;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
//printf( "%d ", nClauses-(1 + Aig_ManCoNum( p->pManAig )) );
    }
//printf( "\n" );

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pVarNums[i] = -1;

    if ( !fChangeVariableOrder )
    {
        // assign variables to the last (nOutputs) POs
        Number = 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number++;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number++;
        pCnf->nVars = Number;
    }
    else
    {
        // assign variables to the last (nOutputs) POs
        Number = Aig_ManObjNumMax(p->pManAig) + 1;
        pCnf->nVars = Number + 1;
        if ( nOutputs )
        {
            if ( Aig_ManRegNum(p->pManAig) == 0 )
            {
                assert( nOutputs == Aig_ManCoNum(p->pManAig) );
                Aig_ManForEachCo( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
            else
            {
                assert( nOutputs == Aig_ManRegNum(p->pManAig) );
                Aig_ManForEachLiSeq( p->pManAig, pObj, i )
                    pCnf->pVarNums[pObj->Id] = Number--;
            }
        }
        // assign variables to the internal nodes
        Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        // assign variables to the PIs and constant node
        Aig_ManForEachCi( p->pManAig, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number--;
        pCnf->pVarNums[Aig_ManConst1(p->pManAig)->Id] = Number--;
        assert( Number >= 0 );
    }

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        pCut = Cnf_ObjBestCut( pObj );

        // save variables of this cut
        OutVar = pCnf->pVarNums[ pObj->Id ];
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCnf->pVarNums[ pCut->pFanins[k] ];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
    }
    Vec_IntFree( vSopTemp );
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p->pManAig)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p->pManAig) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p->pManAig) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}